

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVMValidator.cpp
# Opt level: O0

Result_conflict *
CoreML::validate<(MLModelType)401>(Result_conflict *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  ClassLabelsCase CVar2;
  int iVar3;
  SupportVectorsCase SVar4;
  int32 iVar5;
  int iVar6;
  CoreML *this;
  SupportVectorClassifier *model;
  Kernel *kernel;
  Int64Vector *this_00;
  StringVector *this_01;
  SparseSupportVectors *this_02;
  DenseSupportVectors *this_03;
  Coefficients *pCVar7;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features;
  undefined1 in_R9B;
  undefined1 local_438 [32];
  string local_418;
  string local_3f0;
  undefined1 local_3c8 [4];
  int expected_length;
  undefined1 local_3a8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  string local_348;
  undefined1 local_320 [4];
  int c_1;
  undefined1 local_300 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  int c;
  int perClassSum;
  undefined1 local_258 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  string local_1d0;
  undefined1 local_1a8 [4];
  int totalSVs;
  undefined1 local_188 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  string local_100;
  int K;
  __aligned_membuf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_b0;
  SupportVectorClassifier *svmSpec;
  uchar local_80 [16];
  undefined1 local_70 [48];
  Result_conflict result;
  ModelDescription *description;
  Model *format_local;
  
  result._32_8_ = Specification::Model::description(format);
  Result::Result((Result *)(local_70 + 0x28));
  this = (CoreML *)Specification::ModelDescription::input((ModelDescription *)result._32_8_);
  validateDescriptionsAreAllVectorizableTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_70,this,features);
  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  Result::~Result((Result *)local_70);
  bVar1 = Result::good((Result *)(local_70 + 0x28));
  if (bVar1) {
    model = Specification::Model::supportvectorclassifier(format);
    validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::SupportVectorClassifier>
              ((Result_conflict *)&svmSpec,(CoreML *)format,(Model *)model,
               (SupportVectorClassifier *)0x0,false,(bool)in_R9B);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)&svmSpec);
    Result::~Result((Result *)&svmSpec);
    bVar1 = Result::good((Result *)(local_70 + 0x28));
    if (bVar1) {
      local_b0._M_storage = (uchar  [8])Specification::Model::supportvectorclassifier(format);
      kernel = Specification::SupportVectorClassifier::kernel
                         ((SupportVectorClassifier *)local_b0._M_storage);
      validateKernel((Result_conflict *)&stack0xffffffffffffff28,kernel);
      Result::operator=((Result *)(local_70 + 0x28),(Result *)&stack0xffffffffffffff28);
      Result::~Result((Result *)&stack0xffffffffffffff28);
      bVar1 = Result::good((Result *)(local_70 + 0x28));
      if (bVar1) {
        CVar2 = Specification::SupportVectorClassifier::ClassLabels_case
                          ((SupportVectorClassifier *)local_b0._M_storage);
        if (CVar2 == CLASSLABELS_NOT_SET) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_100,"Int64 class labels must be supplied for SVM classifier.",
                     (allocator *)(local_128._M_storage._M_storage + 7));
          Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          std::allocator<char>::~allocator((allocator<char> *)(local_128._M_storage._M_storage + 7))
          ;
        }
        else {
          if (CVar2 == kStringClassLabels) {
            this_01 = Specification::SupportVectorClassifier::stringclasslabels
                                ((SupportVectorClassifier *)local_b0._M_storage);
            local_100._M_storage._M_storage._4_4_ =
                 Specification::StringVector::vector_size(this_01);
          }
          else if (CVar2 == kInt64ClassLabels) {
            this_00 = Specification::SupportVectorClassifier::int64classlabels
                                ((SupportVectorClassifier *)local_b0._M_storage);
            local_100._M_storage._M_storage._4_4_ = Specification::Int64Vector::vector_size(this_00)
            ;
          }
          iVar3 = Specification::SupportVectorClassifier::coefficients_size
                            ((SupportVectorClassifier *)local_b0._M_storage);
          if (iVar3 == local_100._M_storage._M_storage._4_4_ + -1) {
            local_1d0._M_storage._M_storage[4] = '\0';
            local_1d0._M_storage._M_storage[5] = '\0';
            local_1d0._M_storage._M_storage[6] = '\0';
            local_1d0._M_storage._M_storage[7] = '\0';
            SVar4 = Specification::SupportVectorClassifier::supportVectors_case
                              ((SupportVectorClassifier *)local_b0._M_storage);
            if (SVar4 == kSparseSupportVectors) {
              this_02 = Specification::SupportVectorClassifier::sparsesupportvectors
                                  ((SupportVectorClassifier *)local_b0._M_storage);
              local_1d0._M_storage._M_storage._4_4_ =
                   Specification::SparseSupportVectors::vectors_size(this_02);
            }
            else {
              if (SVar4 != kDenseSupportVectors) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_1d0,"Must specify sparse or dense support vectors",
                           (allocator *)(local_1f8._M_storage._M_storage + 7));
                Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1d0)
                ;
                std::__cxx11::string::~string((string *)&local_1d0);
                std::allocator<char>::~allocator
                          ((allocator<char> *)(local_1f8._M_storage._M_storage + 7));
                goto LAB_003abefa;
              }
              this_03 = Specification::SupportVectorClassifier::densesupportvectors
                                  ((SupportVectorClassifier *)local_b0._M_storage);
              local_1d0._M_storage._M_storage._4_4_ =
                   Specification::DenseSupportVectors::vectors_size(this_03);
            }
            iVar3 = Specification::SupportVectorClassifier::numberofsupportvectorsperclass_size
                              ((SupportVectorClassifier *)local_b0._M_storage);
            if (iVar3 == local_100._M_storage._M_storage._4_4_) {
              local_2a0._M_storage._M_storage[4] = '\0';
              local_2a0._M_storage._M_storage[5] = '\0';
              local_2a0._M_storage._M_storage[6] = '\0';
              local_2a0._M_storage._M_storage[7] = '\0';
              local_2a0._M_storage._M_storage[0] = '\0';
              local_2a0._M_storage._M_storage[1] = '\0';
              local_2a0._M_storage._M_storage[2] = '\0';
              local_2a0._M_storage._M_storage[3] = '\0';
              for (; (int)local_2a0._M_storage._M_storage._0_4_ <
                     (int)local_100._M_storage._M_storage._4_4_;
                  local_2a0._M_storage._M_storage._0_4_ = local_2a0._M_storage._M_storage._0_4_ + 1)
              {
                iVar5 = Specification::SupportVectorClassifier::numberofsupportvectorsperclass
                                  ((SupportVectorClassifier *)local_b0._M_storage,
                                   local_2a0._M_storage._M_storage._0_4_);
                local_2a0._M_storage._M_storage._4_4_ =
                     iVar5 + local_2a0._M_storage._M_storage._4_4_;
              }
              if (local_1d0._M_storage._M_storage._4_4_ == local_2a0._M_storage._M_storage._4_4_) {
                local_348._M_storage._M_storage[4] = '\0';
                local_348._M_storage._M_storage[5] = '\0';
                local_348._M_storage._M_storage[6] = '\0';
                local_348._M_storage._M_storage[7] = '\0';
                for (; (int)local_348._M_storage._M_storage._4_4_ <
                       local_100._M_storage._M_storage._4_4_ + -1;
                    local_348._M_storage._M_storage._4_4_ =
                         local_348._M_storage._M_storage._4_4_ + 1) {
                  pCVar7 = Specification::SupportVectorClassifier::coefficients
                                     ((SupportVectorClassifier *)local_b0._M_storage,
                                      local_348._M_storage._M_storage._4_4_);
                  iVar3 = Specification::Coefficients::alpha_size(pCVar7);
                  if (iVar3 != local_1d0._M_storage._M_storage._4_4_) {
                    std::__cxx11::to_string
                              ((string *)local_3a8,local_1d0._M_storage._M_storage._4_4_);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_3a8 + 0x20),
                                   "Incorrect number of coefficients: There should be ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_3a8);
                    std::operator+(&local_368,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_3a8 + 0x20)," not ");
                    pCVar7 = Specification::SupportVectorClassifier::coefficients
                                       ((SupportVectorClassifier *)local_b0._M_storage,
                                        local_348._M_storage._M_storage._4_4_);
                    iVar3 = Specification::Coefficients::alpha_size(pCVar7);
                    std::__cxx11::to_string((string *)local_3c8,iVar3);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_348,&local_368,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_3c8);
                    Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                   &local_348);
                    std::__cxx11::string::~string((string *)&local_348);
                    std::__cxx11::string::~string((string *)local_3c8);
                    std::__cxx11::string::~string((string *)&local_368);
                    std::__cxx11::string::~string((string *)(local_3a8 + 0x20));
                    std::__cxx11::string::~string((string *)local_3a8);
                    goto LAB_003abefa;
                  }
                }
                iVar3 = Specification::SupportVectorClassifier::proba_size
                                  ((SupportVectorClassifier *)local_b0._M_storage);
                if ((iVar3 != 0) ||
                   (iVar3 = Specification::SupportVectorClassifier::probb_size
                                      ((SupportVectorClassifier *)local_b0._M_storage), iVar3 != 0))
                {
                  local_3f0._M_storage._M_storage._4_4_ =
                       (local_100._M_storage._M_storage._4_4_ *
                       (local_100._M_storage._M_storage._4_4_ + -1)) / 2;
                  iVar3 = Specification::SupportVectorClassifier::proba_size
                                    ((SupportVectorClassifier *)local_b0._M_storage);
                  iVar6 = Specification::SupportVectorClassifier::probb_size
                                    ((SupportVectorClassifier *)local_b0._M_storage);
                  if (iVar3 != iVar6) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_3f0,"probA and probB must be same size",
                               (allocator *)(local_418._M_storage._M_storage + 7));
                    Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                   &local_3f0);
                    std::__cxx11::string::~string((string *)&local_3f0);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)(local_418._M_storage._M_storage + 7));
                    goto LAB_003abefa;
                  }
                  iVar3 = Specification::SupportVectorClassifier::proba_size
                                    ((SupportVectorClassifier *)local_b0._M_storage);
                  if (iVar3 != local_3f0._M_storage._M_storage._4_4_) {
                    std::__cxx11::to_string
                              ((string *)local_438,local_3f0._M_storage._M_storage._4_4_);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_438 + 0x20),
                                   "Expected length of probA is number of class pairs: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_438);
                    Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                   (string *)(local_438 + 0x20));
                    std::__cxx11::string::~string((string *)(local_438 + 0x20));
                    std::__cxx11::string::~string((string *)local_438);
                    goto LAB_003abefa;
                  }
                }
                Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
              }
              else {
                std::__cxx11::to_string((string *)local_300,local_2a0._M_storage._M_storage._4_4_);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_300 + 0x20),"sum of numberOfSupportVectorsPerClass ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_300);
                std::operator+(&local_2c0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_300 + 0x20)," must sum to total number of support vectors ");
                std::__cxx11::to_string((string *)local_320,local_1d0._M_storage._M_storage._4_4_);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_2a0,&local_2c0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_320);
                Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_2a0)
                ;
                std::__cxx11::string::~string((string *)&local_2a0);
                std::__cxx11::string::~string((string *)local_320);
                std::__cxx11::string::~string((string *)&local_2c0);
                std::__cxx11::string::~string((string *)(local_300 + 0x20));
                std::__cxx11::string::~string((string *)local_300);
              }
            }
            else {
              std::__cxx11::to_string((string *)local_258,local_100._M_storage._M_storage._4_4_);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_258 + 0x20),
                             "numberOfSupportVectoresPerClass array must be size numberOfClasses ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_258);
              std::operator+(&local_218,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_258 + 0x20)," instead it is size ");
              iVar3 = Specification::SupportVectorClassifier::numberofsupportvectorsperclass_size
                                ((SupportVectorClassifier *)local_b0._M_storage);
              std::__cxx11::to_string((string *)&c,iVar3);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1f8,&local_218,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c
                            );
              Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f8);
              std::__cxx11::string::~string((string *)&local_1f8);
              std::__cxx11::string::~string((string *)&c);
              std::__cxx11::string::~string((string *)&local_218);
              std::__cxx11::string::~string((string *)(local_258 + 0x20));
              std::__cxx11::string::~string((string *)local_258);
            }
          }
          else {
            std::__cxx11::to_string((string *)local_188,local_100._M_storage._M_storage._4_4_ + -1);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_188 + 0x20),"coefficient array must be size numberOfClasses - 1 ("
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_188);
            std::operator+(&local_148,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_188 + 0x20),"). Instead it is size ");
            iVar3 = Specification::SupportVectorClassifier::coefficients_size
                              ((SupportVectorClassifier *)local_b0._M_storage);
            std::__cxx11::to_string((string *)local_1a8,iVar3);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_128,&local_148,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8);
            Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_128);
            std::__cxx11::string::~string((string *)&local_128);
            std::__cxx11::string::~string((string *)local_1a8);
            std::__cxx11::string::~string((string *)&local_148);
            std::__cxx11::string::~string((string *)(local_188 + 0x20));
            std::__cxx11::string::~string((string *)local_188);
          }
        }
      }
      else {
        Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
      }
    }
    else {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
    }
  }
  else {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
  }
LAB_003abefa:
  local_80[0] = '\x01';
  local_80[1] = '\0';
  local_80[2] = '\0';
  local_80[3] = '\0';
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_supportVectorClassifier>(const Specification::Model& format) {

        const Specification::ModelDescription& description = format.description();

        Result result;

        // Check that inputs are vectorizable
        result = validateDescriptionsAreAllVectorizableTypes(description.input());
        if (!result.good()) {
            return result;
        }

        // Check has a classifier interface
        result = validateClassifierInterface(format, format.supportvectorclassifier());
        if (!result.good()) {
            return result;
        }

        // Validate the params
        const Specification::SupportVectorClassifier& svmSpec = format.supportvectorclassifier();

        result = validateKernel(svmSpec.kernel());
        if (!result.good()) {
            return result;
        }

        // Validate number of coefficients and support vectors are consistent
        int K;
        switch (svmSpec.ClassLabels_case()) {
            case Specification::SupportVectorClassifier::kInt64ClassLabels:
                K = svmSpec.int64classlabels().vector_size();
                break;
            case Specification::SupportVectorClassifier::kStringClassLabels:
                K = svmSpec.stringclasslabels().vector_size();
                break;
            case Specification::SupportVectorClassifier::CLASSLABELS_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Int64 class labels must be supplied for SVM classifier.");
        }

        if (svmSpec.coefficients_size() != K-1) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "coefficient array must be size numberOfClasses - 1 (" +
                                              std::to_string(K-1) +
                                              "). Instead it is size " +
                                              std::to_string(svmSpec.coefficients_size()));
        }

        int totalSVs = 0;
        switch (svmSpec.supportVectors_case()) {
            case Specification::SupportVectorClassifier::kSparseSupportVectors:
                totalSVs = svmSpec.sparsesupportvectors().vectors_size();
                break;
            case Specification::SupportVectorClassifier::kDenseSupportVectors:
                totalSVs = svmSpec.densesupportvectors().vectors_size();
                break;
            default:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Must specify sparse or dense support vectors");
        }

        if(svmSpec.numberofsupportvectorsperclass_size() != K) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "numberOfSupportVectoresPerClass array must be size numberOfClasses " + std::to_string(K) + " instead it is size "
                            +   std::to_string(svmSpec.numberofsupportvectorsperclass_size()));
        }

        int perClassSum = 0;
        for (int c=0; c<K; c++) {
            perClassSum += svmSpec.numberofsupportvectorsperclass(c);
        }

        if (totalSVs != perClassSum) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,

                        "sum of numberOfSupportVectorsPerClass "
                          + std::to_string(perClassSum)
                          + " must sum to total number of support vectors "
                          + std::to_string(totalSVs));
        }

        for (int c=0; c<K-1; c++) {
            if (svmSpec.coefficients(c).alpha_size() != totalSVs) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Incorrect number of coefficients: There should be " +
                                                  std::to_string(totalSVs) +
                                                  " not " +
                                                  std::to_string(svmSpec.coefficients(c).alpha_size()));
            }
        }

        // Validate probA and probB, if given
        if(svmSpec.proba_size() != 0 || svmSpec.probb_size() != 0) {
            int expected_length = K * (K-1) / 2;      // Number of class pairs
            if(svmSpec.proba_size() != svmSpec.probb_size()) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "probA and probB must be same size");
            } else if (svmSpec.proba_size() != expected_length) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Expected length of probA is number of class pairs: " + std::to_string(expected_length));
            }
        }

        return result;
    }